

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void flatview_insert(FlatView *view,uint pos,FlatRange *range)

{
  uint uVar1;
  hwaddr hVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Int128 IVar6;
  Int128 IVar7;
  _Bool _Var8;
  undefined7 uVar9;
  FlatRange *pFVar10;
  ulong uVar11;
  
  if (view->nr == view->nr_allocated) {
    uVar1 = view->nr * 2;
    uVar11 = 10;
    if (10 < uVar1) {
      uVar11 = (ulong)uVar1;
    }
    view->nr_allocated = (uint)uVar11;
    pFVar10 = (FlatRange *)g_realloc(view->ranges,uVar11 << 6);
    view->ranges = pFVar10;
  }
  memmove(view->ranges + (ulong)pos + 1,view->ranges + pos,(ulong)(view->nr - pos) << 6);
  pFVar10 = view->ranges;
  hVar2 = range->offset_in_region;
  IVar6 = (range->addr).start;
  uVar3 = *(undefined8 *)((long)&(range->addr).start + 8);
  IVar7 = (range->addr).size;
  uVar4 = *(undefined8 *)((long)&(range->addr).size + 8);
  _Var8 = range->readonly;
  uVar9 = *(undefined7 *)&range->field_0x31;
  uVar5 = *(undefined8 *)&range->field_0x38;
  pFVar10[pos].mr = range->mr;
  pFVar10[pos].offset_in_region = hVar2;
  *(long *)&pFVar10[pos].addr.start = (long)IVar6;
  *(undefined8 *)((long)&pFVar10[pos].addr.start + 8) = uVar3;
  *(long *)&pFVar10[pos].addr.size = (long)IVar7;
  *(undefined8 *)((long)&pFVar10[pos].addr.size + 8) = uVar4;
  pFVar10 = pFVar10 + pos;
  pFVar10->readonly = _Var8;
  *(undefined7 *)&pFVar10->field_0x31 = uVar9;
  *(undefined8 *)(&pFVar10->readonly + 8) = uVar5;
  view->nr = view->nr + 1;
  return;
}

Assistant:

static void flatview_insert(FlatView *view, unsigned pos, FlatRange *range)
{
    if (view->nr == view->nr_allocated) {
        view->nr_allocated = MAX(2 * view->nr, 10);
        view->ranges = g_realloc(view->ranges,
                                    view->nr_allocated * sizeof(*view->ranges));
    }
    memmove(view->ranges + pos + 1, view->ranges + pos,
            (view->nr - pos) * sizeof(FlatRange));
    view->ranges[pos] = *range;
    ++view->nr;
}